

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
randomx::AssemblyGeneratorX86::h_FSUB_M(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  ostream *poVar1;
  
  instr->dst = instr->dst & 3;
  genAddressReg(this,instr,"eax");
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"\tcvtdq2pd ");
  poVar1 = std::operator<<(poVar1,"xmm12");
  poVar1 = std::operator<<(poVar1,", qword ptr [");
  poVar1 = std::operator<<(poVar1,"rsi");
  poVar1 = std::operator<<(poVar1,"+rax]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"\tsubpd ");
  poVar1 = std::operator<<(poVar1,*(char **)(regF + (ulong)instr->dst * 8));
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"xmm12");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_FSUB_M(Instruction& instr, int i) {
		instr.dst %= RegisterCountFlt;
		genAddressReg(instr);
		asmCode << "\tcvtdq2pd " << tempRegx << ", qword ptr [" << regScratchpadAddr << "+rax]" << std::endl;
		asmCode << "\tsubpd " << regF[instr.dst] << ", " << tempRegx << std::endl;
		traceflt(instr);
	}